

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multiheadattention_x86_fma.cpp
# Opt level: O0

int __thiscall
ncnn::MultiHeadAttention_x86_fma::forward
          (MultiHeadAttention_x86_fma *this,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *_opt)

{
  int *piVar1;
  long *plVar2;
  value_type vVar3;
  size_type sVar4;
  reference pvVar5;
  reference pvVar6;
  void *in_RCX;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_RDX;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_RSI;
  long in_RDI;
  int reto;
  int i_3;
  Option opt1_1;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> qkv_top_blobs;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> qkv_bottom_blobs;
  int i_2;
  vector<int,_std::allocator<int>_> retqkvs;
  Mat qkv_cross;
  int retv;
  Mat v_affine;
  int retqk;
  int i_1;
  Option opt1;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> qk_top_blobs;
  Mat *maskm;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> qk_bottom_blobs;
  int i;
  vector<int,_std::allocator<int>_> retqks;
  Mat qk_cross;
  int retk;
  Mat k_affine;
  int retq;
  Mat q_affine;
  int dst_seqlen;
  int src_seqlen;
  int embed_dim_per_head;
  Mat attn_mask_blob_unpacked;
  Option opt;
  Mat *attn_mask_blob;
  Mat *v_blob;
  Mat *k_blob;
  Mat *q_blob;
  Mat *m;
  value_type *in_stack_ffffffffffffeeb8;
  void **ppvVar7;
  allocator_type *in_stack_ffffffffffffeec0;
  int in_stack_ffffffffffffeec8;
  int in_stack_ffffffffffffeecc;
  Mat *in_stack_ffffffffffffeed0;
  Option *in_stack_ffffffffffffeed8;
  undefined8 in_stack_ffffffffffffeee0;
  int _elempack;
  Mat *in_stack_ffffffffffffeee8;
  Mat *in_stack_ffffffffffffeef0;
  bool local_1021;
  bool local_f09;
  bool local_eb9;
  const_reference local_e90;
  const_reference local_e88;
  const_reference local_e80;
  int local_e6c;
  undefined4 local_e68;
  undefined4 uStack_e64;
  undefined8 uStack_e60;
  undefined8 uStack_e58;
  undefined8 uStack_e50;
  undefined8 local_e48;
  undefined8 uStack_e40;
  undefined8 uStack_e38;
  undefined8 uStack_e30;
  value_type local_e20;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> local_dd0;
  value_type local_db8;
  value_type local_d70;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> local_d20;
  int local_d04;
  vector<int,_std::allocator<int>_> local_d00;
  void *local_ce8;
  int *local_ce0;
  size_t local_cd8;
  int local_cd0;
  Allocator *local_cc8;
  undefined4 local_cc0;
  int local_cbc;
  undefined4 local_cb8;
  undefined4 local_cb4;
  int local_cb0;
  long local_ca8;
  int local_c9c;
  void *local_c98;
  int *local_c90;
  size_t local_c88;
  int local_c80;
  Allocator *local_c78;
  undefined4 local_c70;
  int local_c6c;
  undefined4 local_c68;
  undefined4 local_c64;
  undefined4 local_c60;
  undefined8 local_c58;
  int local_c50;
  int local_c4c;
  undefined4 local_c48;
  undefined4 uStack_c44;
  undefined8 uStack_c40;
  undefined8 uStack_c38;
  undefined8 uStack_c30;
  undefined8 local_c28;
  undefined8 uStack_c20;
  undefined8 uStack_c18;
  undefined8 uStack_c10;
  value_type local_c00;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> local_bb0;
  void *local_b98;
  int *local_b90;
  void *local_b88;
  undefined4 local_b80;
  long *local_b78;
  int local_b70;
  int local_b6c;
  int local_b68;
  int local_b64;
  int local_b60;
  void *local_b58;
  void **local_b50;
  value_type local_b48;
  value_type local_b00;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> local_ab0;
  int local_a94;
  vector<int,_std::allocator<int>_> local_a90;
  void *local_a78;
  int *local_a70;
  size_t local_a68;
  int local_a60;
  Allocator *local_a58;
  undefined4 local_a50;
  int local_a4c;
  undefined4 local_a48;
  undefined4 local_a44;
  int local_a40;
  long local_a38;
  int local_a2c;
  void *local_a28;
  int *local_a20;
  size_t local_a18;
  int local_a10;
  Allocator *local_a08;
  undefined4 local_a00;
  int local_9fc;
  undefined4 local_9f8;
  undefined4 local_9f4;
  undefined4 local_9f0;
  undefined8 local_9e8;
  int local_9dc;
  void *local_9d8;
  int *local_9d0;
  size_t local_9c8;
  int local_9c0;
  Allocator *local_9b8;
  undefined4 local_9b0;
  int local_9ac;
  undefined4 local_9a8;
  undefined4 local_9a4;
  undefined4 local_9a0;
  undefined8 local_998;
  int local_98c;
  int local_988;
  int local_984;
  undefined4 local_980;
  void *local_970;
  int *local_968;
  void *local_960;
  undefined4 local_958;
  long *local_950;
  int local_948;
  int local_944;
  int local_940;
  int local_93c;
  int local_938;
  void *local_930;
  undefined1 local_928 [8];
  undefined8 uStack_920;
  undefined8 uStack_918;
  undefined8 uStack_910;
  undefined7 local_908;
  undefined1 uStack_901;
  undefined8 uStack_900;
  undefined8 uStack_8f8;
  undefined8 uStack_8f0;
  void *local_8e8;
  int *local_8e0;
  size_t local_8d8;
  int local_8d0;
  Allocator *local_8c8;
  int local_8c0;
  int local_8bc;
  int local_8b8;
  int local_8b4;
  int local_8b0;
  size_t local_8a8;
  void **local_8a0;
  const_reference local_898;
  const_reference local_890;
  const_reference local_888;
  void *local_880;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_878;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_870;
  int local_85c;
  void **local_858;
  void **local_850;
  void **local_848;
  void **local_840;
  void **local_838;
  value_type *local_830;
  value_type *local_820;
  void **local_810;
  value_type *local_800;
  value_type *local_7f0;
  value_type *local_7e0;
  value_type *local_7d0;
  void **local_7c0;
  void **local_7b0;
  void **local_7a0;
  void **local_790;
  void **local_780;
  void **local_770;
  void **local_760;
  int local_750;
  undefined4 local_74c;
  reference local_748;
  reference local_740;
  reference local_738;
  int local_730;
  undefined4 local_72c;
  reference local_728;
  reference local_720;
  reference local_718;
  int local_710;
  undefined4 local_70c;
  reference local_708;
  reference local_700;
  reference local_6f8;
  int local_6f0;
  undefined4 local_6ec;
  reference local_6e8;
  reference local_6e0;
  reference local_6d8;
  int local_6d0;
  undefined4 local_6cc;
  reference local_6c8;
  reference local_6c0;
  reference local_6b8;
  int local_6b0;
  undefined4 local_6ac;
  reference local_6a8;
  reference local_6a0;
  reference local_698;
  int local_690;
  undefined4 local_68c;
  void **local_688;
  void **local_680;
  void **local_678;
  void **local_668;
  int local_660;
  undefined4 local_65c;
  reference local_658;
  int local_650;
  undefined4 local_64c;
  reference local_648;
  int local_640;
  undefined4 local_63c;
  reference local_638;
  int local_630;
  undefined4 local_62c;
  reference local_628;
  int local_620;
  undefined4 local_61c;
  reference local_618;
  int local_610;
  undefined4 local_60c;
  reference local_608;
  int local_5f0;
  undefined4 local_5ec;
  void **local_5e8;
  int local_5d0;
  undefined4 local_5cc;
  void **local_5c8;
  int local_5b0;
  undefined4 local_5ac;
  void **local_5a8;
  int local_590;
  undefined4 local_58c;
  void **local_588;
  int local_570;
  undefined4 local_56c;
  void **local_568;
  int local_550;
  undefined4 local_54c;
  void **local_548;
  int local_530;
  undefined4 local_52c;
  void **local_528;
  int local_510;
  undefined4 local_50c;
  value_type *local_508;
  int local_4f0;
  undefined4 local_4ec;
  value_type *local_4e8;
  int local_4d0;
  undefined4 local_4cc;
  value_type *local_4c8;
  int local_4b0;
  undefined4 local_4ac;
  value_type *local_4a8;
  int local_490;
  undefined4 local_48c;
  void **local_488;
  int local_470;
  undefined4 local_46c;
  value_type *local_468;
  int local_450;
  undefined4 local_44c;
  value_type *local_448;
  int local_440;
  undefined4 local_43c;
  void **local_438;
  int local_430;
  undefined4 local_42c;
  void **local_428;
  int local_420;
  undefined4 local_41c;
  void **local_418;
  const_reference local_410;
  void **local_408;
  void **local_400;
  void **local_3f8;
  void **local_3f0;
  void **local_3e8;
  void **local_3e0;
  undefined8 local_3d8;
  undefined8 local_3d0;
  int local_3c8;
  int local_3c4;
  void **local_3c0;
  undefined8 local_3b8;
  undefined8 local_3b0;
  int local_3a8;
  int local_3a4;
  void **local_3a0;
  int local_398;
  int local_394;
  void **local_390;
  value_type *local_388;
  int local_380;
  int local_37c;
  void **local_378;
  value_type *local_370;
  int local_368;
  int local_364;
  void **local_360;
  value_type *local_358;
  int local_350;
  int local_34c;
  void **local_348;
  value_type *local_340;
  int local_338;
  int local_334;
  void **local_330;
  value_type *local_328;
  int local_320;
  int local_31c;
  void **local_318;
  value_type *local_310;
  undefined1 local_305;
  int local_304;
  void **local_300;
  void **local_2f8;
  void *local_2d0;
  void *local_2c8;
  void *local_2c0;
  void *local_2b8;
  void *local_2a8;
  void *local_298;
  void *local_288;
  void *local_278;
  void *local_268;
  void *local_258;
  void *local_248;
  void *local_238;
  void *local_228;
  void *local_218;
  void *local_208;
  void *local_1f8;
  void *local_1e8;
  void *local_1d8;
  void *local_1d0;
  void *local_1c8;
  void *local_1c0;
  void *local_1b8;
  void *local_1b0;
  int local_1a0;
  undefined4 local_19c;
  void **local_198;
  int local_190;
  undefined4 local_18c;
  void **local_188;
  void **local_180;
  void **local_178;
  void **local_170;
  Allocator *local_168;
  int local_15c;
  size_t local_158;
  void *local_150;
  int local_148;
  int local_144;
  value_type *local_140;
  Allocator *local_138;
  int local_12c;
  size_t local_128;
  void *local_120;
  int local_118;
  int local_114;
  value_type *local_110;
  Allocator *local_108;
  int local_fc;
  size_t local_f8;
  void *local_f0;
  int local_e8;
  int local_e4;
  value_type *local_e0;
  Allocator *local_d8;
  int local_cc;
  size_t local_c8;
  void *local_c0;
  int local_b8;
  int local_b4;
  value_type *local_b0;
  Allocator *local_a8;
  int local_9c;
  size_t local_98;
  void *local_90;
  int local_88;
  int local_84;
  value_type *local_80;
  Allocator *local_78;
  int local_6c;
  size_t local_68;
  void *local_60;
  int local_58;
  int local_54;
  value_type *local_50;
  long *local_48;
  undefined4 local_3c;
  void *local_38;
  void *local_30;
  int local_24;
  int local_20;
  int local_1c;
  void **local_18;
  undefined4 local_c;
  long local_8;
  
  _elempack = (int)((ulong)in_stack_ffffffffffffeee0 >> 0x20);
  local_880 = in_RCX;
  local_878 = in_RDX;
  local_870 = in_RSI;
  local_888 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](in_RSI,0);
  sVar4 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_870);
  if ((sVar4 == 1) ||
     ((sVar4 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_870), sVar4 == 2 &&
      (*(int *)(in_RDI + 0xe4) != 0)))) {
    local_e80 = local_888;
  }
  else {
    local_e80 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_870,1);
  }
  local_890 = local_e80;
  sVar4 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_870);
  if ((sVar4 == 1) ||
     ((sVar4 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_870), sVar4 == 2 &&
      (*(int *)(in_RDI + 0xe4) != 0)))) {
    local_e88 = local_888;
  }
  else {
    sVar4 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_870);
    if ((sVar4 == 2) ||
       ((sVar4 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_870), sVar4 == 3 &&
        (*(int *)(in_RDI + 0xe4) != 0)))) {
      local_e90 = local_890;
    }
    else {
      local_e90 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_870,2);
    }
    local_e88 = local_e90;
  }
  local_898 = local_e88;
  if (*(int *)(in_RDI + 0xe4) == 0) {
    local_858 = &local_8e8;
    local_8e8 = (void *)0x0;
    local_8e0 = (int *)0x0;
    local_8d8 = 0;
    local_8d0 = 0;
    local_8c8 = (Allocator *)0x0;
    local_8c0 = 0;
    local_8bc = 0;
    local_8b8 = 0;
    local_8b4 = 0;
    local_8b0 = 0;
    local_8a8 = 0;
  }
  else {
    sVar4 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_870);
    local_410 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_870,sVar4 - 1);
    local_408 = &local_8e8;
    local_8e8 = local_410->data;
    local_8e0 = local_410->refcount;
    local_8d8 = local_410->elemsize;
    local_8d0 = local_410->elempack;
    local_8c8 = local_410->allocator;
    local_8c0 = local_410->dims;
    local_8bc = local_410->w;
    local_8b8 = local_410->h;
    local_8b4 = local_410->d;
    local_8b0 = local_410->c;
    local_8a8 = local_410->cstep;
    local_188 = local_408;
    if (local_8e0 != (int *)0x0) {
      local_18c = 1;
      LOCK();
      local_190 = *local_8e0;
      *local_8e0 = *local_8e0 + 1;
      UNLOCK();
    }
  }
  local_8a0 = &local_8e8;
  memcpy(local_928,local_880,0x40);
  if (*(int *)(in_RDI + 0xec) != 0) {
    uStack_901 = 0;
  }
  local_850 = &local_970;
  local_970 = (void *)0x0;
  local_968 = (int *)0x0;
  local_960 = (void *)0x0;
  local_958 = 0;
  local_950 = (long *)0x0;
  local_948 = 0;
  local_944 = 0;
  local_940 = 0;
  local_93c = 0;
  local_938 = 0;
  local_930 = (void *)0x0;
  if ((*(int *)(in_RDI + 0xe4) == 0) || (*(int *)(local_8a0 + 3) == 1)) {
    local_680 = &local_970;
    if (local_680 != local_8a0) {
      if (local_8a0[1] != (void *)0x0) {
        piVar1 = (int *)local_8a0[1];
        local_68c = 1;
        LOCK();
        local_690 = *piVar1;
        *piVar1 = *piVar1 + 1;
        UNLOCK();
      }
      local_970 = *local_8a0;
      local_968 = (int *)local_8a0[1];
      local_960 = local_8a0[2];
      local_958 = *(undefined4 *)(local_8a0 + 3);
      local_950 = (long *)local_8a0[4];
      local_948 = *(int *)(local_8a0 + 5);
      local_944 = *(int *)((long)local_8a0 + 0x2c);
      local_940 = *(int *)(local_8a0 + 6);
      local_93c = *(int *)((long)local_8a0 + 0x34);
      local_938 = *(int *)(local_8a0 + 7);
      local_930 = local_8a0[8];
      local_668 = local_680;
    }
    local_688 = local_8a0;
    local_678 = local_680;
  }
  else {
    convert_packing(in_stack_ffffffffffffeef0,in_stack_ffffffffffffeee8,_elempack,
                    in_stack_ffffffffffffeed8);
    local_3e0 = &local_970;
    if (local_970 != (void *)0x0) {
      local_180 = local_3e0;
    }
    local_eb9 = local_970 == (void *)0x0 || (long)local_930 * (long)local_938 == 0;
    if (local_eb9) {
      local_85c = -100;
      local_980 = 1;
      goto LAB_01cbb786;
    }
  }
  local_984 = *(int *)(in_RDI + 0xd0) / *(int *)(in_RDI + 0xd4);
  local_988 = local_888->h * local_888->elempack;
  local_98c = local_890->h * local_890->elempack;
  local_848 = &local_9d8;
  local_9d8 = (void *)0x0;
  local_9d0 = (int *)0x0;
  local_9c8 = 0;
  local_9c0 = 0;
  local_9b8 = (Allocator *)0x0;
  local_9b0 = 0;
  local_9ac = 0;
  local_9a8 = 0;
  local_9a4 = 0;
  local_9a0 = 0;
  local_998 = 0;
  local_9dc = (**(code **)(**(long **)(in_RDI + 0x410) + 0x38))
                        (*(long **)(in_RDI + 0x410),local_888,&local_9d8,local_928);
  if (local_9dc == 0) {
    local_840 = &local_a28;
    local_a28 = (void *)0x0;
    local_a20 = (int *)0x0;
    local_a18 = 0;
    local_a10 = 0;
    local_a08 = (Allocator *)0x0;
    local_a00 = 0;
    local_9fc = 0;
    local_9f8 = 0;
    local_9f4 = 0;
    local_9f0 = 0;
    local_9e8 = 0;
    local_a2c = (**(code **)(**(long **)(in_RDI + 0x418) + 0x38))
                          (*(long **)(in_RDI + 0x418),local_890,&local_a28,local_928);
    if (local_a2c == 0) {
      local_3c8 = local_988 * *(int *)(in_RDI + 0xd4);
      local_3c0 = &local_a78;
      local_3c4 = local_98c;
      local_3d0 = 4;
      local_3d8 = uStack_920;
      local_a78 = (void *)0x0;
      local_a70 = (int *)0x0;
      local_a68 = 0;
      local_a60 = 0;
      local_a58 = (Allocator *)0x0;
      local_a50 = 0;
      local_a4c = 0;
      local_a48 = 0;
      local_a44 = 0;
      local_a40 = 0;
      local_a38 = 0;
      Mat::create(in_stack_ffffffffffffeed0,in_stack_ffffffffffffeecc,in_stack_ffffffffffffeec8,
                  (size_t)in_stack_ffffffffffffeec0,(Allocator *)in_stack_ffffffffffffeeb8);
      local_3e8 = &local_a78;
      if (local_a78 != (void *)0x0) {
        local_178 = local_3e8;
      }
      local_f09 = local_a78 != (void *)0x0 && local_a38 * local_a40 != 0;
      if (local_f09) {
        std::vector<int,_std::allocator<int>_>::vector
                  ((vector<int,_std::allocator<int>_> *)0x1cb7689);
        std::vector<int,_std::allocator<int>_>::resize
                  ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffeed0,
                   CONCAT44(in_stack_ffffffffffffeecc,in_stack_ffffffffffffeec8));
        for (local_a94 = 0; local_a94 < *(int *)(in_RDI + 0xd4); local_a94 = local_a94 + 1) {
          std::allocator<ncnn::Mat>::allocator((allocator<ncnn::Mat> *)0x1cb76e2);
          std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::vector
                    ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)in_stack_ffffffffffffeed0,
                     CONCAT44(in_stack_ffffffffffffeecc,in_stack_ffffffffffffeec8),
                     in_stack_ffffffffffffeec0);
          std::allocator<ncnn::Mat>::~allocator((allocator<ncnn::Mat> *)0x1cb770b);
          local_31c = local_a94 * local_984;
          local_310 = &local_b00;
          local_318 = &local_9d8;
          local_320 = local_984;
          local_144 = local_9ac;
          local_150 = (void *)((long)local_9d8 + (long)local_9ac * (long)local_31c * local_9c8);
          local_158 = local_9c8;
          local_15c = local_9c0;
          local_168 = local_9b8;
          local_140 = &local_b00;
          local_148 = local_984;
          local_b00.refcount = (int *)0x0;
          local_b00.elemsize = local_9c8;
          local_b00.elempack = local_9c0;
          local_b00.allocator = local_9b8;
          local_b00.dims = 2;
          local_b00.w = local_9ac;
          local_b00.h = local_984;
          local_b00.d = 1;
          local_b00.c = 1;
          local_b00.cstep = (long)local_9ac * (long)local_984;
          local_b00.data = local_150;
          pvVar5 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](&local_ab0,0);
          local_6a8 = &local_b00;
          local_6a0 = pvVar5;
          if (pvVar5 != local_6a8) {
            if (local_b00.refcount != (int *)0x0) {
              local_6ac = 1;
              LOCK();
              local_6b0 = *local_b00.refcount;
              *local_b00.refcount = *local_b00.refcount + 1;
              UNLOCK();
            }
            local_658 = pvVar5;
            if (pvVar5->refcount != (int *)0x0) {
              piVar1 = pvVar5->refcount;
              local_65c = 0xffffffff;
              LOCK();
              local_660 = *piVar1;
              *piVar1 = *piVar1 + -1;
              UNLOCK();
              if (local_660 == 1) {
                if (pvVar5->allocator == (Allocator *)0x0) {
                  local_1b0 = pvVar5->data;
                  if (local_1b0 != (void *)0x0) {
                    free(local_1b0);
                  }
                }
                else {
                  (*pvVar5->allocator->_vptr_Allocator[3])(pvVar5->allocator,pvVar5->data);
                }
              }
            }
            pvVar5->data = (void *)0x0;
            pvVar5->elemsize = 0;
            pvVar5->elempack = 0;
            pvVar5->dims = 0;
            pvVar5->w = 0;
            pvVar5->h = 0;
            pvVar5->d = 0;
            pvVar5->c = 0;
            pvVar5->cstep = 0;
            pvVar5->refcount = (int *)0x0;
            pvVar5->data = local_6a8->data;
            pvVar5->refcount = local_6a8->refcount;
            pvVar5->elemsize = local_6a8->elemsize;
            pvVar5->elempack = local_6a8->elempack;
            pvVar5->allocator = local_6a8->allocator;
            pvVar5->dims = local_6a8->dims;
            pvVar5->w = local_6a8->w;
            pvVar5->h = local_6a8->h;
            pvVar5->d = local_6a8->d;
            pvVar5->c = local_6a8->c;
            pvVar5->cstep = local_6a8->cstep;
          }
          local_830 = &local_b00;
          local_698 = pvVar5;
          local_448 = local_830;
          if (local_b00.refcount != (int *)0x0) {
            local_44c = 0xffffffff;
            LOCK();
            local_450 = *local_b00.refcount;
            *local_b00.refcount = *local_b00.refcount + -1;
            UNLOCK();
            if (local_450 == 1) {
              if (local_b00.allocator == (Allocator *)0x0) {
                local_2b8 = local_b00.data;
                if (local_b00.data != (void *)0x0) {
                  free(local_b00.data);
                }
              }
              else {
                (*(local_b00.allocator)->_vptr_Allocator[3])(local_b00.allocator,local_b00.data);
              }
            }
          }
          local_b00.data = (void *)0x0;
          local_b00.elemsize = 0;
          local_b00.elempack = 0;
          local_b00.dims = 0;
          local_b00.w = 0;
          local_b00.h = 0;
          local_b00.d = 0;
          local_b00.c = 0;
          local_b00.cstep = 0;
          local_b00.refcount = (int *)0x0;
          local_334 = local_a94 * local_984;
          local_328 = &local_b48;
          local_330 = &local_a28;
          local_338 = local_984;
          local_114 = local_9fc;
          local_120 = (void *)((long)local_a28 + (long)local_9fc * (long)local_334 * local_a18);
          local_128 = local_a18;
          local_12c = local_a10;
          local_138 = local_a08;
          local_110 = &local_b48;
          local_118 = local_984;
          local_b48.refcount = (int *)0x0;
          local_b48.elemsize = local_a18;
          local_b48.elempack = local_a10;
          local_b48.allocator = local_a08;
          local_b48.dims = 2;
          local_b48.w = local_9fc;
          local_b48.h = local_984;
          local_b48.d = 1;
          local_b48.c = 1;
          local_b48.cstep = (long)local_9fc * (long)local_984;
          local_b48.data = local_120;
          pvVar5 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](&local_ab0,1);
          local_6c8 = &local_b48;
          local_6c0 = pvVar5;
          if (pvVar5 != local_6c8) {
            if (local_b48.refcount != (int *)0x0) {
              local_6cc = 1;
              LOCK();
              local_6d0 = *local_b48.refcount;
              *local_b48.refcount = *local_b48.refcount + 1;
              UNLOCK();
            }
            local_648 = pvVar5;
            if (pvVar5->refcount != (int *)0x0) {
              piVar1 = pvVar5->refcount;
              local_64c = 0xffffffff;
              LOCK();
              local_650 = *piVar1;
              *piVar1 = *piVar1 + -1;
              UNLOCK();
              if (local_650 == 1) {
                if (pvVar5->allocator == (Allocator *)0x0) {
                  local_1b8 = pvVar5->data;
                  if (local_1b8 != (void *)0x0) {
                    free(local_1b8);
                  }
                }
                else {
                  (*pvVar5->allocator->_vptr_Allocator[3])(pvVar5->allocator,pvVar5->data);
                }
              }
            }
            pvVar5->data = (void *)0x0;
            pvVar5->elemsize = 0;
            pvVar5->elempack = 0;
            pvVar5->dims = 0;
            pvVar5->w = 0;
            pvVar5->h = 0;
            pvVar5->d = 0;
            pvVar5->c = 0;
            pvVar5->cstep = 0;
            pvVar5->refcount = (int *)0x0;
            pvVar5->data = local_6c8->data;
            pvVar5->refcount = local_6c8->refcount;
            pvVar5->elemsize = local_6c8->elemsize;
            pvVar5->elempack = local_6c8->elempack;
            pvVar5->allocator = local_6c8->allocator;
            pvVar5->dims = local_6c8->dims;
            pvVar5->w = local_6c8->w;
            pvVar5->h = local_6c8->h;
            pvVar5->d = local_6c8->d;
            pvVar5->c = local_6c8->c;
            pvVar5->cstep = local_6c8->cstep;
          }
          local_820 = &local_b48;
          local_6b8 = pvVar5;
          local_468 = local_820;
          if (local_b48.refcount != (int *)0x0) {
            local_46c = 0xffffffff;
            LOCK();
            local_470 = *local_b48.refcount;
            *local_b48.refcount = *local_b48.refcount + -1;
            UNLOCK();
            if (local_470 == 1) {
              if (local_b48.allocator == (Allocator *)0x0) {
                local_2a8 = local_b48.data;
                if (local_b48.data != (void *)0x0) {
                  free(local_b48.data);
                }
              }
              else {
                (*(local_b48.allocator)->_vptr_Allocator[3])(local_b48.allocator,local_b48.data);
              }
            }
          }
          local_b48.data = (void *)0x0;
          local_b48.elemsize = 0;
          local_b48.elempack = 0;
          local_b48.dims = 0;
          local_b48.w = 0;
          local_b48.h = 0;
          local_b48.d = 0;
          local_b48.c = 0;
          local_b48.cstep = 0;
          local_b48.refcount = (int *)0x0;
          if (*(int *)(in_RDI + 0xe4) != 0) {
            if (local_948 == 3) {
              local_2f8 = &local_b98;
              local_300 = &local_970;
              local_30 = (void *)((long)local_970 +
                                 (long)local_930 * (long)local_a94 * (long)local_960);
              local_18 = &local_b98;
              local_b90 = (int *)0x0;
              local_b64 = 1;
              local_b60 = local_93c;
              local_8 = (long)local_944 * (long)local_940 * (long)local_960;
              local_b58 = (void *)((local_8 + 0xfU & 0xfffffffffffffff0) / (ulong)local_960);
              local_b70 = 2;
              local_c = 0x10;
              local_1c = local_944;
              local_20 = local_940;
              local_24 = local_93c;
              local_38 = local_960;
              local_3c = local_958;
              local_48 = local_950;
              local_304 = local_a94;
              local_305 = 1;
              local_b98 = local_30;
            }
            else {
              local_3f8 = &local_b98;
              local_400 = &local_970;
              local_b98 = local_970;
              local_b90 = local_968;
              local_b70 = local_948;
              local_b64 = local_93c;
              local_b60 = local_938;
              local_b58 = local_930;
              local_198 = local_3f8;
              if (local_968 != (int *)0x0) {
                local_19c = 1;
                LOCK();
                local_1a0 = *local_968;
                *local_968 = *local_968 + 1;
                UNLOCK();
              }
            }
            local_b68 = local_940;
            local_b6c = local_944;
            local_b78 = local_950;
            local_b80 = local_958;
            local_b88 = local_960;
            local_b50 = &local_b98;
            std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::push_back
                      ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)in_stack_ffffffffffffeec0,
                       in_stack_ffffffffffffeeb8);
            local_810 = &local_b98;
            local_488 = local_810;
            if (local_b90 != (int *)0x0) {
              local_48c = 0xffffffff;
              LOCK();
              local_490 = *local_b90;
              *local_b90 = *local_b90 + -1;
              UNLOCK();
              if (local_490 == 1) {
                if (local_b78 == (long *)0x0) {
                  local_298 = local_b98;
                  if (local_b98 != (void *)0x0) {
                    free(local_b98);
                  }
                }
                else {
                  (**(code **)(*local_b78 + 0x18))(local_b78,local_b98);
                }
              }
            }
            local_b98 = (void *)0x0;
            local_b88 = (void *)0x0;
            local_b80 = 0;
            local_b70 = 0;
            local_b6c = 0;
            local_b68 = 0;
            local_b64 = 0;
            local_b60 = 0;
            local_b58 = (void *)0x0;
            local_b90 = (int *)0x0;
          }
          std::allocator<ncnn::Mat>::allocator((allocator<ncnn::Mat> *)0x1cb89f6);
          std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::vector
                    ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)in_stack_ffffffffffffeed0,
                     CONCAT44(in_stack_ffffffffffffeecc,in_stack_ffffffffffffeec8),
                     in_stack_ffffffffffffeec0);
          std::allocator<ncnn::Mat>::~allocator((allocator<ncnn::Mat> *)0x1cb8a1f);
          local_34c = local_a94 * local_988;
          local_340 = &local_c00;
          local_348 = &local_a78;
          local_350 = local_988;
          local_e4 = local_a4c;
          local_f0 = (void *)((long)local_a78 + (long)local_a4c * (long)local_34c * local_a68);
          local_f8 = local_a68;
          local_fc = local_a60;
          local_108 = local_a58;
          local_e0 = &local_c00;
          local_e8 = local_988;
          local_c00.refcount = (int *)0x0;
          local_c00.elemsize = local_a68;
          local_c00.elempack = local_a60;
          local_c00.allocator = local_a58;
          local_c00.dims = 2;
          local_c00.w = local_a4c;
          local_c00.h = local_988;
          local_c00.d = 1;
          local_c00.c = 1;
          local_c00.cstep = (long)local_a4c * (long)local_988;
          local_c00.data = local_f0;
          pvVar5 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](&local_bb0,0);
          local_6e8 = &local_c00;
          local_6e0 = pvVar5;
          if (pvVar5 != local_6e8) {
            if (local_c00.refcount != (int *)0x0) {
              local_6ec = 1;
              LOCK();
              local_6f0 = *local_c00.refcount;
              *local_c00.refcount = *local_c00.refcount + 1;
              UNLOCK();
            }
            local_638 = pvVar5;
            if (pvVar5->refcount != (int *)0x0) {
              piVar1 = pvVar5->refcount;
              local_63c = 0xffffffff;
              LOCK();
              local_640 = *piVar1;
              *piVar1 = *piVar1 + -1;
              UNLOCK();
              if (local_640 == 1) {
                if (pvVar5->allocator == (Allocator *)0x0) {
                  local_1c0 = pvVar5->data;
                  if (local_1c0 != (void *)0x0) {
                    free(local_1c0);
                  }
                }
                else {
                  (*pvVar5->allocator->_vptr_Allocator[3])(pvVar5->allocator,pvVar5->data);
                }
              }
            }
            pvVar5->data = (void *)0x0;
            pvVar5->elemsize = 0;
            pvVar5->elempack = 0;
            pvVar5->dims = 0;
            pvVar5->w = 0;
            pvVar5->h = 0;
            pvVar5->d = 0;
            pvVar5->c = 0;
            pvVar5->cstep = 0;
            pvVar5->refcount = (int *)0x0;
            pvVar5->data = local_6e8->data;
            pvVar5->refcount = local_6e8->refcount;
            pvVar5->elemsize = local_6e8->elemsize;
            pvVar5->elempack = local_6e8->elempack;
            pvVar5->allocator = local_6e8->allocator;
            pvVar5->dims = local_6e8->dims;
            pvVar5->w = local_6e8->w;
            pvVar5->h = local_6e8->h;
            pvVar5->d = local_6e8->d;
            pvVar5->c = local_6e8->c;
            pvVar5->cstep = local_6e8->cstep;
          }
          local_800 = &local_c00;
          local_6d8 = pvVar5;
          local_4a8 = local_800;
          if (local_c00.refcount != (int *)0x0) {
            local_4ac = 0xffffffff;
            LOCK();
            local_4b0 = *local_c00.refcount;
            *local_c00.refcount = *local_c00.refcount + -1;
            UNLOCK();
            if (local_4b0 == 1) {
              if (local_c00.allocator == (Allocator *)0x0) {
                local_288 = local_c00.data;
                if (local_c00.data != (void *)0x0) {
                  free(local_c00.data);
                }
              }
              else {
                (*(local_c00.allocator)->_vptr_Allocator[3])(local_c00.allocator,local_c00.data);
              }
            }
          }
          local_c00.data = (void *)0x0;
          local_c00.elemsize = 0;
          local_c00.elempack = 0;
          local_c00.dims = 0;
          local_c00.w = 0;
          local_c00.h = 0;
          local_c00.d = 0;
          local_c00.c = 0;
          local_c00.cstep = 0;
          local_c00.refcount = (int *)0x0;
          local_c28 = CONCAT17(uStack_901,local_908);
          uStack_c20 = uStack_900;
          uStack_c18 = uStack_8f8;
          uStack_c10 = uStack_8f0;
          uStack_c40 = uStack_920;
          uStack_c38 = uStack_918;
          uStack_c30 = uStack_910;
          _local_c48 = CONCAT44(1,local_928._0_4_);
          vVar3 = (**(code **)(**(long **)(in_RDI + 0x430) + 0x30))
                            (*(long **)(in_RDI + 0x430),&local_ab0,&local_bb0,&local_c48);
          pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](&local_a90,(long)local_a94);
          *pvVar6 = vVar3;
          std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::~vector
                    ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)in_stack_ffffffffffffeec0);
          std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::~vector
                    ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)in_stack_ffffffffffffeec0);
        }
        for (local_c4c = 0; local_c4c < *(int *)(in_RDI + 0xd4); local_c4c = local_c4c + 1) {
          pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](&local_a90,(long)local_c4c);
          if (*pvVar6 != 0) {
            pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](&local_a90,(long)local_c4c);
            local_85c = *pvVar6;
            local_980 = 1;
            goto LAB_01cbb0e1;
          }
        }
        local_418 = &local_9d8;
        if (local_9d0 != (int *)0x0) {
          local_41c = 0xffffffff;
          LOCK();
          local_420 = *local_9d0;
          *local_9d0 = *local_9d0 + -1;
          UNLOCK();
          if (local_420 == 1) {
            if (local_9b8 == (Allocator *)0x0) {
              local_2d0 = local_9d8;
              if (local_9d8 != (void *)0x0) {
                free(local_9d8);
              }
            }
            else {
              (*local_9b8->_vptr_Allocator[3])(local_9b8,local_9d8);
            }
          }
        }
        local_9d8 = (void *)0x0;
        local_9c8 = 0;
        local_9c0 = 0;
        local_9b0 = 0;
        local_9ac = 0;
        local_9a8 = 0;
        local_9a4 = 0;
        local_9a0 = 0;
        local_998 = 0;
        local_9d0 = (int *)0x0;
        local_428 = &local_a28;
        if (local_a20 != (int *)0x0) {
          local_42c = 0xffffffff;
          LOCK();
          local_430 = *local_a20;
          *local_a20 = *local_a20 + -1;
          UNLOCK();
          if (local_430 == 1) {
            if (local_a08 == (Allocator *)0x0) {
              local_2c8 = local_a28;
              if (local_a28 != (void *)0x0) {
                free(local_a28);
              }
            }
            else {
              (*local_a08->_vptr_Allocator[3])(local_a08,local_a28);
            }
          }
        }
        local_a28 = (void *)0x0;
        local_a18 = 0;
        local_a10 = 0;
        local_a00 = 0;
        local_9fc = 0;
        local_9f8 = 0;
        local_9f4 = 0;
        local_9f0 = 0;
        local_9e8 = 0;
        local_a20 = (int *)0x0;
        local_c50 = (**(code **)(**(long **)(in_RDI + 0x440) + 0x48))
                              (*(long **)(in_RDI + 0x440),&local_a78,local_928);
        if (local_c50 == 0) {
          local_838 = &local_c98;
          local_c98 = (void *)0x0;
          local_c90 = (int *)0x0;
          local_c88 = 0;
          local_c80 = 0;
          local_c78 = (Allocator *)0x0;
          local_c70 = 0;
          local_c6c = 0;
          local_c68 = 0;
          local_c64 = 0;
          local_c60 = 0;
          local_c58 = 0;
          local_c9c = (**(code **)(**(long **)(in_RDI + 0x420) + 0x38))
                                (*(long **)(in_RDI + 0x420),local_898,&local_c98,local_928);
          if (local_c9c == 0) {
            local_3a8 = local_984 * *(int *)(in_RDI + 0xd4);
            local_3a0 = &local_ce8;
            local_3a4 = local_988;
            local_3b0 = 4;
            local_3b8 = uStack_920;
            local_ce8 = (void *)0x0;
            local_ce0 = (int *)0x0;
            local_cd8 = 0;
            local_cd0 = 0;
            local_cc8 = (Allocator *)0x0;
            local_cc0 = 0;
            local_cbc = 0;
            local_cb8 = 0;
            local_cb4 = 0;
            local_cb0 = 0;
            local_ca8 = 0;
            Mat::create(in_stack_ffffffffffffeed0,in_stack_ffffffffffffeecc,
                        in_stack_ffffffffffffeec8,(size_t)in_stack_ffffffffffffeec0,
                        (Allocator *)in_stack_ffffffffffffeeb8);
            local_3f0 = &local_ce8;
            if (local_ce8 != (void *)0x0) {
              local_170 = local_3f0;
            }
            local_1021 = local_ce8 != (void *)0x0 && local_ca8 * local_cb0 != 0;
            if (local_1021) {
              std::vector<int,_std::allocator<int>_>::vector
                        ((vector<int,_std::allocator<int>_> *)0x1cb9694);
              std::vector<int,_std::allocator<int>_>::resize
                        ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffeed0,
                         CONCAT44(in_stack_ffffffffffffeecc,in_stack_ffffffffffffeec8));
              for (local_d04 = 0; local_d04 < *(int *)(in_RDI + 0xd4); local_d04 = local_d04 + 1) {
                std::allocator<ncnn::Mat>::allocator((allocator<ncnn::Mat> *)0x1cb96ed);
                std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::vector
                          ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)
                           in_stack_ffffffffffffeed0,
                           CONCAT44(in_stack_ffffffffffffeecc,in_stack_ffffffffffffeec8),
                           in_stack_ffffffffffffeec0);
                std::allocator<ncnn::Mat>::~allocator((allocator<ncnn::Mat> *)0x1cb9716);
                local_364 = local_d04 * local_988;
                local_358 = &local_d70;
                local_360 = &local_a78;
                local_368 = local_988;
                local_b4 = local_a4c;
                local_c0 = (void *)((long)local_a78 + (long)local_a4c * (long)local_364 * local_a68)
                ;
                local_c8 = local_a68;
                local_cc = local_a60;
                local_d8 = local_a58;
                local_b0 = &local_d70;
                local_b8 = local_988;
                local_d70.refcount = (int *)0x0;
                local_d70.elemsize = local_a68;
                local_d70.elempack = local_a60;
                local_d70.allocator = local_a58;
                local_d70.dims = 2;
                local_d70.w = local_a4c;
                local_d70.h = local_988;
                local_d70.d = 1;
                local_d70.c = 1;
                local_d70.cstep = (long)local_a4c * (long)local_988;
                local_d70.data = local_c0;
                pvVar5 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                                   (&local_d20,0);
                local_708 = &local_d70;
                local_700 = pvVar5;
                if (pvVar5 != local_708) {
                  if (local_d70.refcount != (int *)0x0) {
                    local_70c = 1;
                    LOCK();
                    local_710 = *local_d70.refcount;
                    *local_d70.refcount = *local_d70.refcount + 1;
                    UNLOCK();
                  }
                  local_628 = pvVar5;
                  if (pvVar5->refcount != (int *)0x0) {
                    piVar1 = pvVar5->refcount;
                    local_62c = 0xffffffff;
                    LOCK();
                    local_630 = *piVar1;
                    *piVar1 = *piVar1 + -1;
                    UNLOCK();
                    if (local_630 == 1) {
                      if (pvVar5->allocator == (Allocator *)0x0) {
                        local_1c8 = pvVar5->data;
                        if (local_1c8 != (void *)0x0) {
                          free(local_1c8);
                        }
                      }
                      else {
                        (*pvVar5->allocator->_vptr_Allocator[3])(pvVar5->allocator,pvVar5->data);
                      }
                    }
                  }
                  pvVar5->data = (void *)0x0;
                  pvVar5->elemsize = 0;
                  pvVar5->elempack = 0;
                  pvVar5->dims = 0;
                  pvVar5->w = 0;
                  pvVar5->h = 0;
                  pvVar5->d = 0;
                  pvVar5->c = 0;
                  pvVar5->cstep = 0;
                  pvVar5->refcount = (int *)0x0;
                  pvVar5->data = local_708->data;
                  pvVar5->refcount = local_708->refcount;
                  pvVar5->elemsize = local_708->elemsize;
                  pvVar5->elempack = local_708->elempack;
                  pvVar5->allocator = local_708->allocator;
                  pvVar5->dims = local_708->dims;
                  pvVar5->w = local_708->w;
                  pvVar5->h = local_708->h;
                  pvVar5->d = local_708->d;
                  pvVar5->c = local_708->c;
                  pvVar5->cstep = local_708->cstep;
                }
                local_7f0 = &local_d70;
                local_6f8 = pvVar5;
                local_4c8 = local_7f0;
                if (local_d70.refcount != (int *)0x0) {
                  local_4cc = 0xffffffff;
                  LOCK();
                  local_4d0 = *local_d70.refcount;
                  *local_d70.refcount = *local_d70.refcount + -1;
                  UNLOCK();
                  if (local_4d0 == 1) {
                    if (local_d70.allocator == (Allocator *)0x0) {
                      local_278 = local_d70.data;
                      if (local_d70.data != (void *)0x0) {
                        free(local_d70.data);
                      }
                    }
                    else {
                      (*(local_d70.allocator)->_vptr_Allocator[3])
                                (local_d70.allocator,local_d70.data);
                    }
                  }
                }
                local_d70.data = (void *)0x0;
                local_d70.elemsize = 0;
                local_d70.elempack = 0;
                local_d70.dims = 0;
                local_d70.w = 0;
                local_d70.h = 0;
                local_d70.d = 0;
                local_d70.c = 0;
                local_d70.cstep = 0;
                local_d70.refcount = (int *)0x0;
                local_37c = local_d04 * local_984;
                local_370 = &local_db8;
                local_378 = &local_c98;
                local_380 = local_984;
                local_84 = local_c6c;
                local_90 = (void *)((long)local_c98 + (long)local_c6c * (long)local_37c * local_c88)
                ;
                local_98 = local_c88;
                local_9c = local_c80;
                local_a8 = local_c78;
                local_80 = &local_db8;
                local_88 = local_984;
                local_db8.refcount = (int *)0x0;
                local_db8.elemsize = local_c88;
                local_db8.elempack = local_c80;
                local_db8.allocator = local_c78;
                local_db8.dims = 2;
                local_db8.w = local_c6c;
                local_db8.h = local_984;
                local_db8.d = 1;
                local_db8.c = 1;
                local_db8.cstep = (long)local_c6c * (long)local_984;
                local_db8.data = local_90;
                pvVar5 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                                   (&local_d20,1);
                local_728 = &local_db8;
                local_720 = pvVar5;
                if (pvVar5 != local_728) {
                  if (local_db8.refcount != (int *)0x0) {
                    local_72c = 1;
                    LOCK();
                    local_730 = *local_db8.refcount;
                    *local_db8.refcount = *local_db8.refcount + 1;
                    UNLOCK();
                  }
                  local_618 = pvVar5;
                  if (pvVar5->refcount != (int *)0x0) {
                    piVar1 = pvVar5->refcount;
                    local_61c = 0xffffffff;
                    LOCK();
                    local_620 = *piVar1;
                    *piVar1 = *piVar1 + -1;
                    UNLOCK();
                    if (local_620 == 1) {
                      if (pvVar5->allocator == (Allocator *)0x0) {
                        local_1d0 = pvVar5->data;
                        if (local_1d0 != (void *)0x0) {
                          free(local_1d0);
                        }
                      }
                      else {
                        (*pvVar5->allocator->_vptr_Allocator[3])(pvVar5->allocator,pvVar5->data);
                      }
                    }
                  }
                  pvVar5->data = (void *)0x0;
                  pvVar5->elemsize = 0;
                  pvVar5->elempack = 0;
                  pvVar5->dims = 0;
                  pvVar5->w = 0;
                  pvVar5->h = 0;
                  pvVar5->d = 0;
                  pvVar5->c = 0;
                  pvVar5->cstep = 0;
                  pvVar5->refcount = (int *)0x0;
                  pvVar5->data = local_728->data;
                  pvVar5->refcount = local_728->refcount;
                  pvVar5->elemsize = local_728->elemsize;
                  pvVar5->elempack = local_728->elempack;
                  pvVar5->allocator = local_728->allocator;
                  pvVar5->dims = local_728->dims;
                  pvVar5->w = local_728->w;
                  pvVar5->h = local_728->h;
                  pvVar5->d = local_728->d;
                  pvVar5->c = local_728->c;
                  pvVar5->cstep = local_728->cstep;
                }
                local_7e0 = &local_db8;
                local_718 = pvVar5;
                local_4e8 = local_7e0;
                if (local_db8.refcount != (int *)0x0) {
                  local_4ec = 0xffffffff;
                  LOCK();
                  local_4f0 = *local_db8.refcount;
                  *local_db8.refcount = *local_db8.refcount + -1;
                  UNLOCK();
                  if (local_4f0 == 1) {
                    if (local_db8.allocator == (Allocator *)0x0) {
                      local_268 = local_db8.data;
                      if (local_db8.data != (void *)0x0) {
                        free(local_db8.data);
                      }
                    }
                    else {
                      (*(local_db8.allocator)->_vptr_Allocator[3])
                                (local_db8.allocator,local_db8.data);
                    }
                  }
                }
                local_db8.data = (void *)0x0;
                local_db8.elemsize = 0;
                local_db8.elempack = 0;
                local_db8.dims = 0;
                local_db8.w = 0;
                local_db8.h = 0;
                local_db8.d = 0;
                local_db8.c = 0;
                local_db8.cstep = 0;
                local_db8.refcount = (int *)0x0;
                std::allocator<ncnn::Mat>::allocator((allocator<ncnn::Mat> *)0x1cba07a);
                std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::vector
                          ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)
                           in_stack_ffffffffffffeed0,
                           CONCAT44(in_stack_ffffffffffffeecc,in_stack_ffffffffffffeec8),
                           in_stack_ffffffffffffeec0);
                std::allocator<ncnn::Mat>::~allocator((allocator<ncnn::Mat> *)0x1cba0a3);
                local_394 = local_d04 * local_984;
                local_388 = &local_e20;
                local_390 = &local_ce8;
                local_398 = local_984;
                local_54 = local_cbc;
                local_60 = (void *)((long)local_ce8 + (long)local_cbc * (long)local_394 * local_cd8)
                ;
                local_68 = local_cd8;
                local_6c = local_cd0;
                local_78 = local_cc8;
                local_50 = &local_e20;
                local_58 = local_984;
                local_e20.refcount = (int *)0x0;
                local_e20.elemsize = local_cd8;
                local_e20.elempack = local_cd0;
                local_e20.allocator = local_cc8;
                local_e20.dims = 2;
                local_e20.w = local_cbc;
                local_e20.h = local_984;
                local_e20.d = 1;
                local_e20.c = 1;
                local_e20.cstep = (long)local_cbc * (long)local_984;
                local_e20.data = local_60;
                pvVar5 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                                   (&local_dd0,0);
                local_748 = &local_e20;
                local_740 = pvVar5;
                if (pvVar5 != local_748) {
                  if (local_e20.refcount != (int *)0x0) {
                    local_74c = 1;
                    LOCK();
                    local_750 = *local_e20.refcount;
                    *local_e20.refcount = *local_e20.refcount + 1;
                    UNLOCK();
                  }
                  local_608 = pvVar5;
                  if (pvVar5->refcount != (int *)0x0) {
                    piVar1 = pvVar5->refcount;
                    local_60c = 0xffffffff;
                    LOCK();
                    local_610 = *piVar1;
                    *piVar1 = *piVar1 + -1;
                    UNLOCK();
                    if (local_610 == 1) {
                      if (pvVar5->allocator == (Allocator *)0x0) {
                        local_1d8 = pvVar5->data;
                        if (local_1d8 != (void *)0x0) {
                          free(local_1d8);
                        }
                      }
                      else {
                        (*pvVar5->allocator->_vptr_Allocator[3])(pvVar5->allocator,pvVar5->data);
                      }
                    }
                  }
                  pvVar5->data = (void *)0x0;
                  pvVar5->elemsize = 0;
                  pvVar5->elempack = 0;
                  pvVar5->dims = 0;
                  pvVar5->w = 0;
                  pvVar5->h = 0;
                  pvVar5->d = 0;
                  pvVar5->c = 0;
                  pvVar5->cstep = 0;
                  pvVar5->refcount = (int *)0x0;
                  pvVar5->data = local_748->data;
                  pvVar5->refcount = local_748->refcount;
                  pvVar5->elemsize = local_748->elemsize;
                  pvVar5->elempack = local_748->elempack;
                  pvVar5->allocator = local_748->allocator;
                  pvVar5->dims = local_748->dims;
                  pvVar5->w = local_748->w;
                  pvVar5->h = local_748->h;
                  pvVar5->d = local_748->d;
                  pvVar5->c = local_748->c;
                  pvVar5->cstep = local_748->cstep;
                }
                local_7d0 = &local_e20;
                local_738 = pvVar5;
                local_508 = local_7d0;
                if (local_e20.refcount != (int *)0x0) {
                  local_50c = 0xffffffff;
                  LOCK();
                  local_510 = *local_e20.refcount;
                  *local_e20.refcount = *local_e20.refcount + -1;
                  UNLOCK();
                  if (local_510 == 1) {
                    if (local_e20.allocator == (Allocator *)0x0) {
                      local_258 = local_e20.data;
                      if (local_e20.data != (void *)0x0) {
                        free(local_e20.data);
                      }
                    }
                    else {
                      (*(local_e20.allocator)->_vptr_Allocator[3])
                                (local_e20.allocator,local_e20.data);
                    }
                  }
                }
                local_e20.data = (void *)0x0;
                local_e20.elemsize = 0;
                local_e20.elempack = 0;
                local_e20.dims = 0;
                local_e20.w = 0;
                local_e20.h = 0;
                local_e20.d = 0;
                local_e20.c = 0;
                local_e20.cstep = 0;
                local_e20.refcount = (int *)0x0;
                local_e48 = CONCAT17(uStack_901,local_908);
                uStack_e40 = uStack_900;
                uStack_e38 = uStack_8f8;
                uStack_e30 = uStack_8f0;
                uStack_e60 = uStack_920;
                uStack_e58 = uStack_918;
                uStack_e50 = uStack_910;
                _local_e68 = CONCAT44(1,local_928._0_4_);
                vVar3 = (**(code **)(**(long **)(in_RDI + 0x438) + 0x30))
                                  (*(long **)(in_RDI + 0x438),&local_d20,&local_dd0,&local_e68);
                pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                                   (&local_d00,(long)local_d04);
                *pvVar6 = vVar3;
                std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::~vector
                          ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)
                           in_stack_ffffffffffffeec0);
                std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::~vector
                          ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)
                           in_stack_ffffffffffffeec0);
              }
              for (local_e6c = 0; local_e6c < *(int *)(in_RDI + 0xd4); local_e6c = local_e6c + 1) {
                pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                                   (&local_d00,(long)local_e6c);
                if (*pvVar6 != 0) {
                  pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                                     (&local_d00,(long)local_e6c);
                  local_85c = *pvVar6;
                  goto LAB_01cbac6b;
                }
              }
              local_438 = &local_c98;
              if (local_c90 != (int *)0x0) {
                local_43c = 0xffffffff;
                LOCK();
                local_440 = *local_c90;
                *local_c90 = *local_c90 + -1;
                UNLOCK();
                if (local_440 == 1) {
                  if (local_c78 == (Allocator *)0x0) {
                    local_2c0 = local_c98;
                    if (local_c98 != (void *)0x0) {
                      free(local_c98);
                    }
                  }
                  else {
                    (*local_c78->_vptr_Allocator[3])(local_c78,local_c98);
                  }
                }
              }
              local_c98 = (void *)0x0;
              local_c88 = 0;
              local_c80 = 0;
              local_c70 = 0;
              local_c6c = 0;
              local_c68 = 0;
              local_c64 = 0;
              local_c60 = 0;
              local_c58 = 0;
              local_c90 = (int *)0x0;
              plVar2 = *(long **)(in_RDI + 0x428);
              pvVar5 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_878,0);
              local_85c = (**(code **)(*plVar2 + 0x38))(plVar2,&local_ce8,pvVar5,local_928);
              if (local_85c == 0) {
                local_85c = 0;
              }
LAB_01cbac6b:
              local_980 = 1;
              std::vector<int,_std::allocator<int>_>::~vector
                        ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffeec0);
            }
            else {
              local_85c = -100;
              local_980 = 1;
            }
            local_7c0 = &local_ce8;
            local_528 = local_7c0;
            if (local_ce0 != (int *)0x0) {
              local_52c = 0xffffffff;
              LOCK();
              local_530 = *local_ce0;
              *local_ce0 = *local_ce0 + -1;
              UNLOCK();
              if (local_530 == 1) {
                if (local_cc8 == (Allocator *)0x0) {
                  local_248 = local_ce8;
                  if (local_ce8 != (void *)0x0) {
                    free(local_ce8);
                  }
                }
                else {
                  (*local_cc8->_vptr_Allocator[3])(local_cc8,local_ce8);
                }
              }
            }
            local_ce8 = (void *)0x0;
            local_cd8 = 0;
            local_cd0 = 0;
            local_cc0 = 0;
            local_cbc = 0;
            local_cb8 = 0;
            local_cb4 = 0;
            local_cb0 = 0;
            local_ca8 = 0;
            local_ce0 = (int *)0x0;
          }
          else {
            local_980 = 1;
            local_85c = local_c9c;
          }
          local_7b0 = &local_c98;
          local_548 = local_7b0;
          if (local_c90 != (int *)0x0) {
            local_54c = 0xffffffff;
            LOCK();
            local_550 = *local_c90;
            *local_c90 = *local_c90 + -1;
            UNLOCK();
            if (local_550 == 1) {
              if (local_c78 == (Allocator *)0x0) {
                local_238 = local_c98;
                if (local_c98 != (void *)0x0) {
                  free(local_c98);
                }
              }
              else {
                (*local_c78->_vptr_Allocator[3])(local_c78,local_c98);
              }
            }
          }
          local_c98 = (void *)0x0;
          local_c88 = 0;
          local_c80 = 0;
          local_c70 = 0;
          local_c6c = 0;
          local_c68 = 0;
          local_c64 = 0;
          local_c60 = 0;
          local_c58 = 0;
          local_c90 = (int *)0x0;
        }
        else {
          local_980 = 1;
          local_85c = local_c50;
        }
LAB_01cbb0e1:
        std::vector<int,_std::allocator<int>_>::~vector
                  ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffeec0);
      }
      else {
        local_85c = -100;
        local_980 = 1;
      }
      ppvVar7 = &local_a78;
      local_7a0 = ppvVar7;
      local_568 = ppvVar7;
      if (local_a70 != (int *)0x0) {
        local_56c = 0xffffffff;
        LOCK();
        local_570 = *local_a70;
        *local_a70 = *local_a70 + -1;
        UNLOCK();
        if (local_570 == 1) {
          if (local_a58 == (Allocator *)0x0) {
            local_228 = local_a78;
            if (local_a78 != (void *)0x0) {
              free(local_a78);
            }
          }
          else {
            (*local_a58->_vptr_Allocator[3])(local_a58,local_a78);
          }
        }
      }
      *ppvVar7 = (void *)0x0;
      ppvVar7[2] = (void *)0x0;
      *(undefined4 *)(ppvVar7 + 3) = 0;
      *(undefined4 *)(ppvVar7 + 5) = 0;
      *(undefined4 *)((long)ppvVar7 + 0x2c) = 0;
      *(undefined4 *)(ppvVar7 + 6) = 0;
      *(undefined4 *)((long)ppvVar7 + 0x34) = 0;
      *(undefined4 *)(ppvVar7 + 7) = 0;
      ppvVar7[8] = (void *)0x0;
      ppvVar7[1] = (void *)0x0;
    }
    else {
      local_980 = 1;
      local_85c = local_a2c;
    }
    ppvVar7 = &local_a28;
    local_790 = ppvVar7;
    local_588 = ppvVar7;
    if (local_a20 != (int *)0x0) {
      local_58c = 0xffffffff;
      LOCK();
      local_590 = *local_a20;
      *local_a20 = *local_a20 + -1;
      UNLOCK();
      if (local_590 == 1) {
        if (local_a08 == (Allocator *)0x0) {
          local_218 = local_a28;
          if (local_a28 != (void *)0x0) {
            free(local_a28);
          }
        }
        else {
          (*local_a08->_vptr_Allocator[3])(local_a08,local_a28);
        }
      }
    }
    *ppvVar7 = (void *)0x0;
    ppvVar7[2] = (void *)0x0;
    *(undefined4 *)(ppvVar7 + 3) = 0;
    *(undefined4 *)(ppvVar7 + 5) = 0;
    *(undefined4 *)((long)ppvVar7 + 0x2c) = 0;
    *(undefined4 *)(ppvVar7 + 6) = 0;
    *(undefined4 *)((long)ppvVar7 + 0x34) = 0;
    *(undefined4 *)(ppvVar7 + 7) = 0;
    ppvVar7[8] = (void *)0x0;
    ppvVar7[1] = (void *)0x0;
  }
  else {
    local_980 = 1;
    local_85c = local_9dc;
  }
  ppvVar7 = &local_9d8;
  local_780 = ppvVar7;
  local_5a8 = ppvVar7;
  if (local_9d0 != (int *)0x0) {
    local_5ac = 0xffffffff;
    LOCK();
    local_5b0 = *local_9d0;
    *local_9d0 = *local_9d0 + -1;
    UNLOCK();
    if (local_5b0 == 1) {
      if (local_9b8 == (Allocator *)0x0) {
        local_208 = local_9d8;
        if (local_9d8 != (void *)0x0) {
          free(local_9d8);
        }
      }
      else {
        (*local_9b8->_vptr_Allocator[3])(local_9b8,local_9d8);
      }
    }
  }
  *ppvVar7 = (void *)0x0;
  ppvVar7[2] = (void *)0x0;
  *(undefined4 *)(ppvVar7 + 3) = 0;
  *(undefined4 *)(ppvVar7 + 5) = 0;
  *(undefined4 *)((long)ppvVar7 + 0x2c) = 0;
  *(undefined4 *)(ppvVar7 + 6) = 0;
  *(undefined4 *)((long)ppvVar7 + 0x34) = 0;
  *(undefined4 *)(ppvVar7 + 7) = 0;
  ppvVar7[8] = (void *)0x0;
  ppvVar7[1] = (void *)0x0;
LAB_01cbb786:
  ppvVar7 = &local_970;
  local_770 = ppvVar7;
  local_5c8 = ppvVar7;
  if (local_968 != (int *)0x0) {
    local_5cc = 0xffffffff;
    LOCK();
    local_5d0 = *local_968;
    *local_968 = *local_968 + -1;
    UNLOCK();
    if (local_5d0 == 1) {
      if (local_950 == (long *)0x0) {
        local_1f8 = local_970;
        if (local_970 != (void *)0x0) {
          free(local_970);
        }
      }
      else {
        (**(code **)(*local_950 + 0x18))(local_950,local_970);
      }
    }
  }
  *ppvVar7 = (void *)0x0;
  ppvVar7[2] = (void *)0x0;
  *(undefined4 *)(ppvVar7 + 3) = 0;
  *(undefined4 *)(ppvVar7 + 5) = 0;
  *(undefined4 *)((long)ppvVar7 + 0x2c) = 0;
  *(undefined4 *)(ppvVar7 + 6) = 0;
  *(undefined4 *)((long)ppvVar7 + 0x34) = 0;
  *(undefined4 *)(ppvVar7 + 7) = 0;
  ppvVar7[8] = (void *)0x0;
  ppvVar7[1] = (void *)0x0;
  ppvVar7 = &local_8e8;
  if (local_8e0 != (int *)0x0) {
    local_5ec = 0xffffffff;
    LOCK();
    local_5f0 = *local_8e0;
    *local_8e0 = *local_8e0 + -1;
    UNLOCK();
    if (local_5f0 == 1) {
      local_760 = ppvVar7;
      local_5e8 = ppvVar7;
      if (local_8c8 == (Allocator *)0x0) {
        local_1e8 = local_8e8;
        if (local_8e8 != (void *)0x0) {
          free(local_8e8);
        }
      }
      else {
        (*local_8c8->_vptr_Allocator[3])(local_8c8,local_8e8);
      }
    }
  }
  *ppvVar7 = (void *)0x0;
  ppvVar7[2] = (void *)0x0;
  *(undefined4 *)(ppvVar7 + 3) = 0;
  *(undefined4 *)(ppvVar7 + 5) = 0;
  *(undefined4 *)((long)ppvVar7 + 0x2c) = 0;
  *(undefined4 *)(ppvVar7 + 6) = 0;
  *(undefined4 *)((long)ppvVar7 + 0x34) = 0;
  *(undefined4 *)(ppvVar7 + 7) = 0;
  ppvVar7[8] = (void *)0x0;
  ppvVar7[1] = (void *)0x0;
  return local_85c;
}

Assistant:

int MultiHeadAttention_x86_fma::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& _opt) const
{
    const Mat& q_blob = bottom_blobs[0];
    const Mat& k_blob = (bottom_blobs.size() == 1 || (bottom_blobs.size() == 2 && attn_mask)) ? q_blob : bottom_blobs[1];
    const Mat& v_blob = (bottom_blobs.size() == 1 || (bottom_blobs.size() == 2 && attn_mask)) ? q_blob : (bottom_blobs.size() == 2 || (bottom_blobs.size() == 3 && attn_mask)) ? k_blob : bottom_blobs[2];
    const Mat& attn_mask_blob = attn_mask ? bottom_blobs[bottom_blobs.size() - 1] : Mat();

    Option opt = _opt;
    if (int8_scale_term)
    {
        opt.use_packing_layout = false; // TODO enable packing
    }

    Mat attn_mask_blob_unpacked;
    if (attn_mask && attn_mask_blob.elempack != 1)
    {
        convert_packing(attn_mask_blob, attn_mask_blob_unpacked, 1, opt);
        if (attn_mask_blob_unpacked.empty())
            return -100;
    }
    else
    {
        attn_mask_blob_unpacked = attn_mask_blob;
    }

    const int embed_dim_per_head = embed_dim / num_heads;
    const int src_seqlen = q_blob.h * q_blob.elempack;
    const int dst_seqlen = k_blob.h * k_blob.elempack;

    Mat q_affine;
    int retq = q_gemm->forward(q_blob, q_affine, opt);
    if (retq != 0)
        return retq;

    Mat k_affine;
    int retk = k_gemm->forward(k_blob, k_affine, opt);
    if (retk != 0)
        return retk;

    Mat qk_cross(dst_seqlen, src_seqlen * num_heads, 4u, opt.blob_allocator);
    if (qk_cross.empty())
        return -100;

    std::vector<int> retqks;
    retqks.resize(num_heads);
    #pragma omp parallel for num_threads(opt.num_threads)
    for (int i = 0; i < num_heads; i++)
    {
        std::vector<Mat> qk_bottom_blobs(2);
        qk_bottom_blobs[0] = q_affine.row_range(i * embed_dim_per_head, embed_dim_per_head);
        qk_bottom_blobs[1] = k_affine.row_range(i * embed_dim_per_head, embed_dim_per_head);
        if (attn_mask)
        {
            const Mat& maskm = attn_mask_blob_unpacked.dims == 3 ? attn_mask_blob_unpacked.channel(i) : attn_mask_blob_unpacked;
            qk_bottom_blobs.push_back(maskm);
        }
        std::vector<Mat> qk_top_blobs(1);
        qk_top_blobs[0] = qk_cross.row_range(i * src_seqlen, src_seqlen);
        Option opt1 = opt;
        opt1.num_threads = 1;
        retqks[i] = qk_gemm->forward(qk_bottom_blobs, qk_top_blobs, opt1);
    }
    for (int i = 0; i < num_heads; i++)
    {
        if (retqks[i] != 0)
            return retqks[i];
    }

    q_affine.release();
    k_affine.release();

    int retqk = qk_softmax->forward_inplace(qk_cross, opt);
    if (retqk != 0)
        return retqk;

    Mat v_affine;
    int retv = v_gemm->forward(v_blob, v_affine, opt);
    if (retv != 0)
        return retv;

    Mat qkv_cross(src_seqlen, embed_dim_per_head * num_heads, 4u, opt.blob_allocator);
    if (qkv_cross.empty())
        return -100;

    std::vector<int> retqkvs;
    retqkvs.resize(num_heads);
    #pragma omp parallel for num_threads(opt.num_threads)
    for (int i = 0; i < num_heads; i++)
    {
        std::vector<Mat> qkv_bottom_blobs(2);
        qkv_bottom_blobs[0] = qk_cross.row_range(i * src_seqlen, src_seqlen);
        qkv_bottom_blobs[1] = v_affine.row_range(i * embed_dim_per_head, embed_dim_per_head);
        std::vector<Mat> qkv_top_blobs(1);
        qkv_top_blobs[0] = qkv_cross.row_range(i * embed_dim_per_head, embed_dim_per_head);
        Option opt1 = opt;
        opt1.num_threads = 1;
        retqkvs[i] = qkv_gemm->forward(qkv_bottom_blobs, qkv_top_blobs, opt1);
    }
    for (int i = 0; i < num_heads; i++)
    {
        if (retqkvs[i] != 0)
            return retqkvs[i];
    }

    v_affine.release();

    int reto = o_gemm->forward(qkv_cross, top_blobs[0], opt);
    if (reto != 0)
        return reto;

    return 0;
}